

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.h
# Opt level: O0

void __thiscall ArgParser::ArgParser(ArgParser *this,string *preInfo,string *postInfo)

{
  string *postInfo_local;
  string *preInfo_local;
  ArgParser *this_local;
  
  std::vector<ArgHolder,_std::allocator<ArgHolder>_>::vector(&this->m_args);
  std::__cxx11::string::string((string *)&this->m_preInfo,(string *)preInfo);
  std::__cxx11::string::string((string *)&this->m_postInfo,(string *)postInfo);
  return;
}

Assistant:

ArgParser(std::string preInfo = "", std::string postInfo = "")
        : m_preInfo(preInfo), m_postInfo(postInfo) {}